

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool __thiscall ON_SubDRTree::CreateSubDEmptyRTree(ON_SubDRTree *this,ON_SubD *subd)

{
  ON_SubD *subd_local;
  ON_SubDRTree *this_local;
  
  ON_SubD::ShareContentsFrom((ON_SubD *)(this + 0x48),subd);
  ON_RTree::RemoveAll((ON_RTree *)this);
  return true;
}

Assistant:

bool ON_SubDRTree::CreateSubDEmptyRTree(
  const ON_SubD& subd
)
{
  // ShareContentsFrom() increments the reference count on m_subdimple_sp
  // so vertex pointers one this RTree's nodes will be valid for the duration
  // of the rtree's existence.
  m_subd.ShareContentsFrom(const_cast<ON_SubD&>(subd));
  this->RemoveAll();
  return true;
}